

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

void nullcPrintComplexVariableInfo(ExternTypeInfo *type,char *ptr,uint indentDepth)

{
  ExternTypeInfo *type_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ExternTypeInfo *pEVar5;
  ExternMemberInfo *pEVar6;
  size_t sVar7;
  uint uVar8;
  char *__s;
  
  pcVar4 = nullcDebugSymbols((uint *)0x0);
  pEVar5 = nullcDebugTypeInfo((uint *)0x0);
  pEVar6 = nullcDebugTypeExtraInfo((uint *)0x0);
  uVar8 = type->offsetToName;
  sVar7 = strlen(pcVar4 + uVar8);
  __s = pcVar4 + uVar8 + (sVar7 & 0xffffffff) + 1;
  for (uVar8 = 0; uVar8 < (type->field_8).arrSize; uVar8 = uVar8 + 1) {
    uVar2 = (type->field_11).subType + uVar8;
    uVar1 = pEVar6[uVar2].type;
    uVar2 = pEVar6[uVar2].offset;
    type_00 = pEVar5 + uVar1;
    nullcPrintDepthIndent(indentDepth);
    printf("%s %s",pcVar4 + pEVar5[uVar1].offsetToName,__s);
    if ((pEVar5[uVar1].subCat & ~CAT_POINTER) == CAT_NONE) {
      printf(" = ");
      nullcPrintBasicVariableInfo(type_00,ptr + uVar2);
      putchar(10);
    }
    else {
      iVar3 = strcmp(pcVar4 + type_00->offsetToName,"typeid");
      if (iVar3 == 0) {
        printf(" = %s\n",pcVar4 + pEVar5[*(int *)(ptr + uVar2)].offsetToName);
      }
      else {
        putchar(10);
        nullcPrintVariableInfo(type_00,ptr + uVar2,indentDepth + 1);
      }
    }
    sVar7 = strlen(__s);
    __s = __s + ((int)sVar7 + 1);
  }
  return;
}

Assistant:

void nullcPrintComplexVariableInfo(const ExternTypeInfo& type, char* ptr, unsigned indentDepth)
{
	char *codeSymbols = nullcDebugSymbols(NULL);
	ExternTypeInfo *codeTypes = nullcDebugTypeInfo(NULL);
	ExternMemberInfo *codeTypeExtra = nullcDebugTypeExtraInfo(NULL);

	const char *memberName = codeSymbols + type.offsetToName + (unsigned)strlen(codeSymbols + type.offsetToName) + 1;

	for(unsigned i = 0; i < type.memberCount; i++)
	{
		ExternTypeInfo &memberType = codeTypes[codeTypeExtra[type.memberOffset + i].type];

		unsigned localOffset = codeTypeExtra[type.memberOffset + i].offset;

		nullcPrintDepthIndent(indentDepth);
		printf("%s %s", codeSymbols + memberType.offsetToName, memberName);

		if(memberType.subCat == ExternTypeInfo::CAT_NONE || memberType.subCat == ExternTypeInfo::CAT_POINTER)
		{
			printf(" = ");
			nullcPrintBasicVariableInfo(memberType, ptr + localOffset);
			printf("\n");
		}
		else if(strcmp(codeSymbols + memberType.offsetToName, "typeid") == 0)
		{
			printf(" = %s\n", codeSymbols + codeTypes[*(int*)(ptr + localOffset)].offsetToName);
		}
		else
		{
			printf("\n");
			nullcPrintVariableInfo(memberType, ptr + localOffset, indentDepth + 1);
		}

		memberName += (unsigned)strlen(memberName) + 1;
	}
}